

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderPlatformWindowsDefault(void *platform_render_arg,void *renderer_render_arg)

{
  ImGuiViewport *pIVar1;
  _func_void_ImGuiViewport_ptr_void_ptr *p_Var2;
  ImGuiContext *pIVar3;
  long lVar4;
  
  pIVar3 = GImGui;
  if (GImGui != (ImGuiContext *)0x0) {
    if (1 < (GImGui->PlatformIO).Viewports.Size) {
      lVar4 = 1;
      do {
        pIVar1 = (pIVar3->PlatformIO).Viewports.Data[lVar4];
        if ((pIVar1->Flags & 0x400) == 0) {
          p_Var2 = (pIVar3->PlatformIO).Platform_RenderWindow;
          if (p_Var2 != (_func_void_ImGuiViewport_ptr_void_ptr *)0x0) {
            (*p_Var2)(pIVar1,platform_render_arg);
          }
          p_Var2 = (pIVar3->PlatformIO).Renderer_RenderWindow;
          if (p_Var2 != (_func_void_ImGuiViewport_ptr_void_ptr *)0x0) {
            (*p_Var2)(pIVar1,renderer_render_arg);
          }
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < (pIVar3->PlatformIO).Viewports.Size);
    }
    if (1 < (pIVar3->PlatformIO).Viewports.Size) {
      lVar4 = 1;
      do {
        pIVar1 = (pIVar3->PlatformIO).Viewports.Data[lVar4];
        if ((pIVar1->Flags & 0x400) == 0) {
          p_Var2 = (pIVar3->PlatformIO).Platform_SwapBuffers;
          if (p_Var2 != (_func_void_ImGuiViewport_ptr_void_ptr *)0x0) {
            (*p_Var2)(pIVar1,platform_render_arg);
          }
          p_Var2 = (pIVar3->PlatformIO).Renderer_SwapBuffers;
          if (p_Var2 != (_func_void_ImGuiViewport_ptr_void_ptr *)0x0) {
            (*p_Var2)(pIVar1,renderer_render_arg);
          }
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < (pIVar3->PlatformIO).Viewports.Size);
    }
    return;
  }
  __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() or ImGui::SetCurrentContext()?\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0xddc,"ImGuiPlatformIO &ImGui::GetPlatformIO()");
}

Assistant:

ImGuiPlatformIO& ImGui::GetPlatformIO()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() or ImGui::SetCurrentContext()?");
    return GImGui->PlatformIO;
}